

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O0

void dasm_free(BuildCtx *ctx)

{
  dasm_State *__ptr;
  int local_1c;
  int i;
  dasm_State *D;
  BuildCtx *ctx_local;
  
  __ptr = ctx->D;
  for (local_1c = 0; local_1c < __ptr->maxsection; local_1c = local_1c + 1) {
    if (__ptr->sections[local_1c].buf != (int *)0x0) {
      free(__ptr->sections[local_1c].buf);
    }
  }
  if (__ptr->pclabels != (int *)0x0) {
    free(__ptr->pclabels);
  }
  if (__ptr->lglabels != (int *)0x0) {
    free(__ptr->lglabels);
  }
  free(__ptr);
  return;
}

Assistant:

void dasm_free(Dst_DECL)
{
  dasm_State *D = Dst_REF;
  int i;
  for (i = 0; i < D->maxsection; i++)
    if (D->sections[i].buf)
      DASM_M_FREE(Dst, D->sections[i].buf, D->sections[i].bsize);
  if (D->pclabels) DASM_M_FREE(Dst, D->pclabels, D->pcsize);
  if (D->lglabels) DASM_M_FREE(Dst, D->lglabels, D->lgsize);
  DASM_M_FREE(Dst, D, D->psize);
}